

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall mocker::nasm::Section::emplaceLine<mocker::nasm::Leave>(Section *this,string *label)

{
  size_t *psVar1;
  _Node *p_Var2;
  shared_ptr<mocker::nasm::Leave> local_28;
  
  local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e96e8;
  local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Inst_001e9738;
  p_Var2 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
           _M_create_node<std::__cxx11::string,std::shared_ptr<mocker::nasm::Leave>>
                     ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,
                      label,&local_28);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->lines).super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }